

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mul.c
# Opt level: O1

unsigned_long bn_sub_part_words(unsigned_long *r,unsigned_long *a,unsigned_long *b,int cl,int dl)

{
  long lVar1;
  unsigned_long uVar2;
  ulong uVar3;
  unsigned_long *puVar4;
  unsigned_long *puVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  
  uVar9 = (ulong)(uint)dl;
  uVar3 = bn_sub_words(r,a,b,cl);
  if (dl == 0) {
    return uVar3;
  }
  puVar4 = r + cl;
  if (dl < 0) {
    uVar2 = b[cl];
    *puVar4 = -(uVar3 + uVar2);
    if (uVar2 != 0) {
      uVar3 = 1;
    }
    if (dl == -1) {
      return uVar3;
    }
    lVar10 = 0;
    while( true ) {
      iVar11 = dl + (int)lVar10;
      uVar2 = b[(long)cl + lVar10 + 1];
      r[(long)cl + lVar10 + 1] = -(uVar3 + uVar2);
      if (uVar2 != 0) {
        uVar3 = 1;
      }
      if (iVar11 == -2) {
        return uVar3;
      }
      uVar2 = b[(long)cl + lVar10 + 2];
      r[(long)cl + lVar10 + 2] = -(uVar3 + uVar2);
      if (uVar2 != 0) {
        uVar3 = 1;
      }
      if (-4 < iVar11) break;
      uVar2 = b[(long)cl + lVar10 + 3];
      r[(long)cl + lVar10 + 3] = -(uVar3 + uVar2);
      if (uVar2 != 0) {
        uVar3 = 1;
      }
      if (iVar11 == -4) {
        return uVar3;
      }
      lVar1 = uVar3 + b[(long)cl + lVar10 + 4];
      if (b[(long)cl + lVar10 + 4] != 0) {
        uVar3 = 1;
      }
      r[(long)cl + lVar10 + 4] = -lVar1;
      lVar10 = lVar10 + 4;
      if (-6 < dl + -4 + (int)lVar10) {
        return uVar3;
      }
    }
    return uVar3;
  }
  puVar5 = a + cl;
  if (uVar3 != 0) {
    do {
      iVar11 = (int)uVar9;
      uVar2 = a[cl];
      r[cl] = uVar2 - uVar3;
      if (uVar2 != 0) {
        uVar3 = 0;
      }
      if (iVar11 < 2) {
        uVar9 = 0;
        goto LAB_00113c84;
      }
      uVar2 = a[(long)cl + 1];
      r[(long)cl + 1] = uVar2 - uVar3;
      if (uVar2 != 0) {
        uVar3 = 0;
      }
      uVar9 = 0;
      if (iVar11 == 2) goto LAB_00113c84;
      uVar2 = a[(long)cl + 2];
      r[(long)cl + 2] = uVar2 - uVar3;
      if (uVar2 != 0) {
        uVar3 = 0;
      }
      uVar9 = 0;
      if (iVar11 < 4) goto LAB_00113c84;
      uVar2 = a[(long)cl + 3];
      r[(long)cl + 3] = uVar2 - uVar3;
      if (uVar2 != 0) {
        uVar3 = 0;
      }
      if (iVar11 == 4) {
        puVar5 = a + cl;
        puVar4 = r + cl;
        uVar9 = 0;
        goto LAB_00113c84;
      }
      uVar9 = (ulong)(iVar11 - 4);
      puVar5 = puVar5 + 4;
      puVar4 = puVar4 + 4;
      a = a + 4;
      r = r + 4;
    } while (uVar3 != 0);
  }
  iVar11 = (int)uVar9;
  uVar3 = 0;
LAB_00113c84:
  iVar7 = (int)uVar9;
  iVar8 = 0;
  if ((iVar7 < 1) || (iVar6 = iVar11 - iVar7, iVar8 = iVar7, iVar11 <= iVar7)) goto LAB_00113cd1;
  if (iVar6 == 3) {
LAB_00113cbd:
    puVar4[3] = puVar5[3];
    iVar8 = iVar7 + -1;
  }
  else {
    if (iVar6 == 2) {
LAB_00113caa:
      puVar4[2] = puVar5[2];
      if (1 < iVar7) {
        iVar7 = iVar7 + -1;
        goto LAB_00113cbd;
      }
    }
    else {
      if (iVar6 != 1) goto LAB_00113cc7;
      puVar4[1] = puVar5[1];
      if (iVar7 != 1) {
        iVar7 = iVar7 + -1;
        goto LAB_00113caa;
      }
    }
    iVar8 = 0;
  }
LAB_00113cc7:
  puVar5 = puVar5 + 4;
  puVar4 = puVar4 + 4;
LAB_00113cd1:
  if ((0 < iVar8) && (*puVar4 = *puVar5, iVar8 != 1)) {
    lVar10 = 4;
    iVar11 = iVar8 + 4;
    while (puVar4[lVar10 + -3] = puVar5[lVar10 + -3], iVar11 != 6) {
      iVar8 = iVar11 + -4;
      puVar4[lVar10 + -2] = puVar5[lVar10 + -2];
      if (iVar8 < 4) {
        return uVar3;
      }
      puVar4[lVar10 + -1] = puVar5[lVar10 + -1];
      if (iVar11 == 8) {
        return uVar3;
      }
      puVar4[lVar10] = puVar5[lVar10];
      lVar10 = lVar10 + 4;
      iVar11 = iVar8;
      if (iVar8 < 6) {
        return uVar3;
      }
    }
  }
  return uVar3;
}

Assistant:

BN_ULONG bn_sub_part_words(BN_ULONG *r,
                           const BN_ULONG *a, const BN_ULONG *b,
                           int cl, int dl)
{
    BN_ULONG c, t;

    assert(cl >= 0);
    c = bn_sub_words(r, a, b, cl);

    if (dl == 0)
        return c;

    r += cl;
    a += cl;
    b += cl;

    if (dl < 0) {
        for (;;) {
            t = b[0];
            r[0] = (0 - t - c) & BN_MASK2;
            if (t != 0)
                c = 1;
            if (++dl >= 0)
                break;

            t = b[1];
            r[1] = (0 - t - c) & BN_MASK2;
            if (t != 0)
                c = 1;
            if (++dl >= 0)
                break;

            t = b[2];
            r[2] = (0 - t - c) & BN_MASK2;
            if (t != 0)
                c = 1;
            if (++dl >= 0)
                break;

            t = b[3];
            r[3] = (0 - t - c) & BN_MASK2;
            if (t != 0)
                c = 1;
            if (++dl >= 0)
                break;

            b += 4;
            r += 4;
        }
    } else {
        int save_dl = dl;
        while (c) {
            t = a[0];
            r[0] = (t - c) & BN_MASK2;
            if (t != 0)
                c = 0;
            if (--dl <= 0)
                break;

            t = a[1];
            r[1] = (t - c) & BN_MASK2;
            if (t != 0)
                c = 0;
            if (--dl <= 0)
                break;

            t = a[2];
            r[2] = (t - c) & BN_MASK2;
            if (t != 0)
                c = 0;
            if (--dl <= 0)
                break;

            t = a[3];
            r[3] = (t - c) & BN_MASK2;
            if (t != 0)
                c = 0;
            if (--dl <= 0)
                break;

            save_dl = dl;
            a += 4;
            r += 4;
        }
        if (dl > 0) {
            if (save_dl > dl) {
                switch (save_dl - dl) {
                case 1:
                    r[1] = a[1];
                    if (--dl <= 0)
                        break;
                case 2:
                    r[2] = a[2];
                    if (--dl <= 0)
                        break;
                case 3:
                    r[3] = a[3];
                    if (--dl <= 0)
                        break;
                }
                a += 4;
                r += 4;
            }
        }
        if (dl > 0) {
            for (;;) {
                r[0] = a[0];
                if (--dl <= 0)
                    break;
                r[1] = a[1];
                if (--dl <= 0)
                    break;
                r[2] = a[2];
                if (--dl <= 0)
                    break;
                r[3] = a[3];
                if (--dl <= 0)
                    break;

                a += 4;
                r += 4;
            }
        }
    }
    return c;
}